

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::probe_dominator_lrat(Internal *this,int dom,Clause *reason)

{
  char cVar1;
  literal_iterator piVar2;
  Flags *pFVar3;
  Var *pVVar4;
  uint64_t *puVar5;
  Clause *in_RDX;
  int in_ESI;
  Internal *in_RDI;
  uint64_t id;
  uint uidx;
  Var u;
  Flags *f;
  int other;
  int lit;
  literal_iterator __end1;
  literal_iterator __begin1;
  Clause *__range1;
  int iVar6;
  Internal *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  int *local_28;
  Clause *pCVar7;
  undefined4 in_stack_fffffffffffffff0;
  
  if (((in_RDI->lrat & 1U) != 0) && (in_ESI != 0)) {
    pCVar7 = in_RDX;
    local_28 = Clause::begin(in_RDX);
    piVar2 = Clause::end(in_RDX);
    for (; local_28 != piVar2; local_28 = local_28 + 1) {
      iVar6 = *local_28;
      cVar1 = val(in_RDI,iVar6);
      if ((cVar1 < '\0') && (-iVar6 != in_ESI)) {
        iVar6 = (int)((ulong)in_RDI >> 0x20);
        pFVar3 = flags(in_stack_ffffffffffffffa0,iVar6);
        if (((uint)*pFVar3 & 1) == 0) {
          *pFVar3 = (Flags)((uint)*pFVar3 & 0xfffffffe | 1);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_ffffffffffffffb0,
                     (value_type_conflict3 *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          pVVar4 = var(in_stack_ffffffffffffffa0,iVar6);
          in_stack_ffffffffffffffb0 = *(vector<int,_std::allocator<int>_> **)pVVar4;
          if ((int)in_stack_ffffffffffffffb0 == 0) {
            in_stack_ffffffffffffffac = vlit(in_stack_ffffffffffffffa0,iVar6);
            puVar5 = unit_clauses(in_stack_ffffffffffffffa0,iVar6);
            in_stack_ffffffffffffffa0 = (Internal *)*puVar5;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffffb0,
                       (value_type_conflict5 *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          }
          else if (pVVar4->reason != (Clause *)0x0) {
            probe_dominator_lrat
                      ((Internal *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       (int)((ulong)pCVar7 >> 0x20),in_RDX);
          }
        }
      }
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffb0,
               (value_type_conflict5 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
              );
  }
  return;
}

Assistant:

void Internal::probe_dominator_lrat (int dom, Clause *reason) {
  if (!lrat || !dom)
    return;
  LOG (reason, "probe dominator LRAT for %d from", dom);
  for (const auto lit : *reason) {
    if (val (lit) >= 0)
      continue;
    const auto other = -lit;
    if (other == dom)
      continue;
    Flags &f = flags (other);
    if (f.seen)
      continue;
    f.seen = true;
    analyzed.push_back (other);
    Var u = var (other);
    if (u.level) {
      if (!u.reason) {
        LOG ("this may be a problem %d", other);
        continue;
      }
      probe_dominator_lrat (dom, u.reason);
      continue;
    }
    const unsigned uidx = vlit (other);
    uint64_t id = unit_clauses (uidx);
    assert (id);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (reason->id);
}